

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::dump(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
       *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *val,bool pretty_print,bool ensure_ascii,uint indent_step,uint current_indent)

{
  bool bVar1;
  char cVar2;
  size_type sVar3;
  pointer ppVar4;
  ulong uVar5;
  reference pbVar6;
  undefined8 uVar7;
  reference pvVar8;
  element_type *peVar9;
  __normal_iterator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
  local_c0;
  __normal_iterator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
  local_b8;
  __normal_iterator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
  local_b0;
  const_iterator i_3;
  __normal_iterator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
  local_a0;
  __normal_iterator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
  local_98;
  const_iterator i_2;
  const_iterator cStack_88;
  uint new_indent_1;
  size_t local_80;
  _Self local_78;
  _Self local_70;
  ulong local_68;
  size_t cnt_1;
  const_iterator i_1;
  _Self local_48;
  _Self local_40;
  ulong local_38;
  size_t cnt;
  const_iterator i;
  uint new_indent;
  uint current_indent_local;
  uint indent_step_local;
  bool ensure_ascii_local;
  bool pretty_print_local;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *val_local;
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_local;
  
  i._M_node._4_4_ = current_indent;
  switch(val->m_type) {
  case null:
    peVar9 = std::
             __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    (*peVar9->_vptr_output_adapter_protocol[1])(peVar9,"null",4);
    break;
  case object:
    bVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
            ::empty((val->m_value).object);
    if (bVar1) {
      peVar9 = std::
               __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      (*peVar9->_vptr_output_adapter_protocol[1])(peVar9,"{}",2);
    }
    else if (pretty_print) {
      peVar9 = std::
               __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      (*peVar9->_vptr_output_adapter_protocol[1])(peVar9,"{\n",2);
      i._M_node._0_4_ = i._M_node._4_4_ + indent_step;
      uVar5 = std::__cxx11::string::size();
      if (uVar5 < (uint)i._M_node) {
        cVar2 = std::__cxx11::string::size();
        std::__cxx11::string::resize((ulong)&this->indent_string,cVar2 << 1);
      }
      cnt = (size_t)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
                    ::cbegin((val->m_value).object);
      local_38 = 0;
      while (uVar5 = local_38,
            sVar3 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
                    ::size((val->m_value).object), uVar5 < sVar3 - 1) {
        peVar9 = std::
                 __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        uVar7 = std::__cxx11::string::c_str();
        (*peVar9->_vptr_output_adapter_protocol[1])(peVar9,uVar7,(ulong)(uint)i._M_node);
        peVar9 = std::
                 __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        (**peVar9->_vptr_output_adapter_protocol)(peVar9,0x22);
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                               *)&cnt);
        dump_escaped(this,&ppVar4->first,ensure_ascii);
        peVar9 = std::
                 __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        (*peVar9->_vptr_output_adapter_protocol[1])(peVar9,"\": ",3);
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                               *)&cnt);
        dump(this,&ppVar4->second,true,ensure_ascii,indent_step,(uint)i._M_node);
        peVar9 = std::
                 __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        (*peVar9->_vptr_output_adapter_protocol[1])(peVar9,",\n",2);
        local_38 = local_38 + 1;
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                      *)&cnt);
      }
      local_40._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
           ::cend((val->m_value).object);
      bVar1 = std::operator!=((_Self *)&cnt,&local_40);
      if (!bVar1) {
        __assert_fail("i != val.m_value.object->cend()",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                      ,0x24e2,
                      "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      local_48._M_node =
           (_Base_ptr)
           std::
           next<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                     ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                       )cnt,1);
      i_1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
            ::cend((val->m_value).object);
      bVar1 = std::operator==(&local_48,&i_1);
      if (!bVar1) {
        __assert_fail("std::next(i) == val.m_value.object->cend()",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                      ,0x24e3,
                      "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      peVar9 = std::
               __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      uVar7 = std::__cxx11::string::c_str();
      (*peVar9->_vptr_output_adapter_protocol[1])(peVar9,uVar7,(ulong)(uint)i._M_node);
      peVar9 = std::
               __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      (**peVar9->_vptr_output_adapter_protocol)(peVar9,0x22);
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                             *)&cnt);
      dump_escaped(this,&ppVar4->first,ensure_ascii);
      peVar9 = std::
               __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      (*peVar9->_vptr_output_adapter_protocol[1])(peVar9,"\": ",3);
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                             *)&cnt);
      dump(this,&ppVar4->second,true,ensure_ascii,indent_step,(uint)i._M_node);
      peVar9 = std::
               __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      (**peVar9->_vptr_output_adapter_protocol)(peVar9,10);
      peVar9 = std::
               __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      uVar7 = std::__cxx11::string::c_str();
      (*peVar9->_vptr_output_adapter_protocol[1])(peVar9,uVar7,(ulong)i._M_node._4_4_);
      peVar9 = std::
               __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      (**peVar9->_vptr_output_adapter_protocol)(peVar9,0x7d);
    }
    else {
      peVar9 = std::
               __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      (**peVar9->_vptr_output_adapter_protocol)(peVar9,0x7b);
      cnt_1 = (size_t)std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
                      ::cbegin((val->m_value).object);
      local_68 = 0;
      while (uVar5 = local_68,
            sVar3 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
                    ::size((val->m_value).object), uVar5 < sVar3 - 1) {
        peVar9 = std::
                 __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        (**peVar9->_vptr_output_adapter_protocol)(peVar9,0x22);
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                               *)&cnt_1);
        dump_escaped(this,&ppVar4->first,ensure_ascii);
        peVar9 = std::
                 __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        (*peVar9->_vptr_output_adapter_protocol[1])(peVar9,"\":",2);
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                               *)&cnt_1);
        dump(this,&ppVar4->second,false,ensure_ascii,indent_step,i._M_node._4_4_);
        peVar9 = std::
                 __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        (**peVar9->_vptr_output_adapter_protocol)(peVar9,0x2c);
        local_68 = local_68 + 1;
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                      *)&cnt_1);
      }
      local_70._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
           ::cend((val->m_value).object);
      bVar1 = std::operator!=((_Self *)&cnt_1,&local_70);
      if (!bVar1) {
        __assert_fail("i != val.m_value.object->cend()",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                      ,0x24fb,
                      "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      local_80 = cnt_1;
      local_78._M_node =
           (_Base_ptr)
           std::
           next<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                     ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                       )cnt_1,1);
      cStack_88 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
                  ::cend((val->m_value).object);
      bVar1 = std::operator==(&local_78,&stack0xffffffffffffff78);
      if (!bVar1) {
        __assert_fail("std::next(i) == val.m_value.object->cend()",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                      ,0x24fc,
                      "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      peVar9 = std::
               __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      (**peVar9->_vptr_output_adapter_protocol)(peVar9,0x22);
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                             *)&cnt_1);
      dump_escaped(this,&ppVar4->first,ensure_ascii);
      peVar9 = std::
               __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      (*peVar9->_vptr_output_adapter_protocol[1])(peVar9,"\":",2);
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                             *)&cnt_1);
      dump(this,&ppVar4->second,false,ensure_ascii,indent_step,i._M_node._4_4_);
      peVar9 = std::
               __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      (**peVar9->_vptr_output_adapter_protocol)(peVar9,0x7d);
    }
    break;
  case array:
    bVar1 = std::
            vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
            ::empty((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                     *)(val->m_value).object);
    if (bVar1) {
      peVar9 = std::
               __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      (*peVar9->_vptr_output_adapter_protocol[1])(peVar9,"[]",2);
    }
    else if (pretty_print) {
      peVar9 = std::
               __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      (*peVar9->_vptr_output_adapter_protocol[1])(peVar9,"[\n",2);
      i_2._M_current._4_4_ = i._M_node._4_4_ + indent_step;
      uVar5 = std::__cxx11::string::size();
      if (uVar5 < i_2._M_current._4_4_) {
        cVar2 = std::__cxx11::string::size();
        std::__cxx11::string::resize((ulong)&this->indent_string,cVar2 << 1);
      }
      local_98._M_current =
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)std::
              vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
              ::cbegin((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                        *)(val->m_value).object);
      while( true ) {
        i_3 = std::
              vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
              ::cend((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                      *)(val->m_value).object);
        local_a0 = __gnu_cxx::
                   __normal_iterator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
                   ::operator-(&i_3,1);
        bVar1 = __gnu_cxx::operator!=(&local_98,&local_a0);
        if (!bVar1) break;
        peVar9 = std::
                 __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        uVar7 = std::__cxx11::string::c_str();
        (*peVar9->_vptr_output_adapter_protocol[1])(peVar9,uVar7,(ulong)i_2._M_current._4_4_);
        pbVar6 = __gnu_cxx::
                 __normal_iterator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
                 ::operator*(&local_98);
        dump(this,pbVar6,true,ensure_ascii,indent_step,i_2._M_current._4_4_);
        peVar9 = std::
                 __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        (*peVar9->_vptr_output_adapter_protocol[1])(peVar9,",\n",2);
        __gnu_cxx::
        __normal_iterator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
        ::operator++(&local_98);
      }
      bVar1 = std::
              vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
              ::empty((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                       *)(val->m_value).object);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("not val.m_value.array->empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                      ,0x251f,
                      "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      peVar9 = std::
               __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      uVar7 = std::__cxx11::string::c_str();
      (*peVar9->_vptr_output_adapter_protocol[1])(peVar9,uVar7,(ulong)i_2._M_current._4_4_);
      pvVar8 = std::
               vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
               ::back((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                       *)(val->m_value).object);
      dump(this,pvVar8,true,ensure_ascii,indent_step,i_2._M_current._4_4_);
      peVar9 = std::
               __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      (**peVar9->_vptr_output_adapter_protocol)(peVar9,10);
      peVar9 = std::
               __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      uVar7 = std::__cxx11::string::c_str();
      (*peVar9->_vptr_output_adapter_protocol[1])(peVar9,uVar7,(ulong)i._M_node._4_4_);
      peVar9 = std::
               __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      (**peVar9->_vptr_output_adapter_protocol)(peVar9,0x5d);
    }
    else {
      peVar9 = std::
               __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      (**peVar9->_vptr_output_adapter_protocol)(peVar9,0x5b);
      local_b0._M_current =
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)std::
              vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
              ::cbegin((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                        *)(val->m_value).object);
      while( true ) {
        local_c0._M_current =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)std::
                vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                ::cend((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                        *)(val->m_value).object);
        local_b8 = __gnu_cxx::
                   __normal_iterator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
                   ::operator-(&local_c0,1);
        bVar1 = __gnu_cxx::operator!=(&local_b0,&local_b8);
        if (!bVar1) break;
        pbVar6 = __gnu_cxx::
                 __normal_iterator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
                 ::operator*(&local_b0);
        dump(this,pbVar6,false,ensure_ascii,indent_step,i._M_node._4_4_);
        peVar9 = std::
                 __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        (**peVar9->_vptr_output_adapter_protocol)(peVar9,0x2c);
        __gnu_cxx::
        __normal_iterator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
        ::operator++(&local_b0);
      }
      bVar1 = std::
              vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
              ::empty((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                       *)(val->m_value).object);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("not val.m_value.array->empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                      ,0x2530,
                      "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      pvVar8 = std::
               vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
               ::back((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                       *)(val->m_value).object);
      dump(this,pvVar8,false,ensure_ascii,indent_step,i._M_node._4_4_);
      peVar9 = std::
               __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      (**peVar9->_vptr_output_adapter_protocol)(peVar9,0x5d);
    }
    break;
  case string:
    peVar9 = std::
             __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    (**peVar9->_vptr_output_adapter_protocol)(peVar9,0x22);
    dump_escaped(this,(string_t *)(val->m_value).object,ensure_ascii);
    peVar9 = std::
             __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    (**peVar9->_vptr_output_adapter_protocol)(peVar9,0x22);
    break;
  case boolean:
    if (((val->m_value).boolean & 1U) == 0) {
      peVar9 = std::
               __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      (*peVar9->_vptr_output_adapter_protocol[1])(peVar9,"false",5);
    }
    else {
      peVar9 = std::
               __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      (*peVar9->_vptr_output_adapter_protocol[1])(peVar9,"true",4);
    }
    break;
  case number_integer:
    dump_integer<long,_0>(this,(val->m_value).number_integer);
    break;
  case number_unsigned:
    dump_integer<unsigned_long,_0>(this,(val->m_value).number_unsigned);
    break;
  case number_float:
    dump_float(this,(val->m_value).number_float);
    break;
  case discarded:
    peVar9 = std::
             __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    (*peVar9->_vptr_output_adapter_protocol[1])(peVar9,"<discarded>",0xb);
  }
  return;
}

Assistant:

void dump(const BasicJsonType& val, const bool pretty_print, const bool ensure_ascii,
			  const unsigned int indent_step, const unsigned int current_indent = 0) {
		switch (val.m_type) {
			case value_t::object: {
				if (val.m_value.object->empty()) {
					o->write_characters("{}", 2);
					return;
				}

				if (pretty_print) {
					o->write_characters("{\n", 2);

					// variable to hold indentation for recursive calls
					const auto new_indent = current_indent + indent_step;
					if (JSON_UNLIKELY(indent_string.size() < new_indent)) {
						indent_string.resize(indent_string.size() * 2, ' ');
					}

					// first n-1 elements
					auto i = val.m_value.object->cbegin();
					for (std::size_t cnt = 0; cnt < val.m_value.object->size() - 1; ++cnt, ++i) {
						o->write_characters(indent_string.c_str(), new_indent);
						o->write_character('\"');
						dump_escaped(i->first, ensure_ascii);
						o->write_characters("\": ", 3);
						dump(i->second, true, ensure_ascii, indent_step, new_indent);
						o->write_characters(",\n", 2);
					}

					// last element
					assert(i != val.m_value.object->cend());
					assert(std::next(i) == val.m_value.object->cend());
					o->write_characters(indent_string.c_str(), new_indent);
					o->write_character('\"');
					dump_escaped(i->first, ensure_ascii);
					o->write_characters("\": ", 3);
					dump(i->second, true, ensure_ascii, indent_step, new_indent);

					o->write_character('\n');
					o->write_characters(indent_string.c_str(), current_indent);
					o->write_character('}');
				} else {
					o->write_character('{');

					// first n-1 elements
					auto i = val.m_value.object->cbegin();
					for (std::size_t cnt = 0; cnt < val.m_value.object->size() - 1; ++cnt, ++i) {
						o->write_character('\"');
						dump_escaped(i->first, ensure_ascii);
						o->write_characters("\":", 2);
						dump(i->second, false, ensure_ascii, indent_step, current_indent);
						o->write_character(',');
					}

					// last element
					assert(i != val.m_value.object->cend());
					assert(std::next(i) == val.m_value.object->cend());
					o->write_character('\"');
					dump_escaped(i->first, ensure_ascii);
					o->write_characters("\":", 2);
					dump(i->second, false, ensure_ascii, indent_step, current_indent);

					o->write_character('}');
				}

				return;
			}

			case value_t::array: {
				if (val.m_value.array->empty()) {
					o->write_characters("[]", 2);
					return;
				}

				if (pretty_print) {
					o->write_characters("[\n", 2);

					// variable to hold indentation for recursive calls
					const auto new_indent = current_indent + indent_step;
					if (JSON_UNLIKELY(indent_string.size() < new_indent)) {
						indent_string.resize(indent_string.size() * 2, ' ');
					}

					// first n-1 elements
					for (auto i = val.m_value.array->cbegin(); i != val.m_value.array->cend() - 1; ++i) {
						o->write_characters(indent_string.c_str(), new_indent);
						dump(*i, true, ensure_ascii, indent_step, new_indent);
						o->write_characters(",\n", 2);
					}

					// last element
					assert(not val.m_value.array->empty());
					o->write_characters(indent_string.c_str(), new_indent);
					dump(val.m_value.array->back(), true, ensure_ascii, indent_step, new_indent);

					o->write_character('\n');
					o->write_characters(indent_string.c_str(), current_indent);
					o->write_character(']');
				} else {
					o->write_character('[');

					// first n-1 elements
					for (auto i = val.m_value.array->cbegin(); i != val.m_value.array->cend() - 1; ++i) {
						dump(*i, false, ensure_ascii, indent_step, current_indent);
						o->write_character(',');
					}

					// last element
					assert(not val.m_value.array->empty());
					dump(val.m_value.array->back(), false, ensure_ascii, indent_step, current_indent);

					o->write_character(']');
				}

				return;
			}

			case value_t::string: {
				o->write_character('\"');
				dump_escaped(*val.m_value.string, ensure_ascii);
				o->write_character('\"');
				return;
			}

			case value_t::boolean: {
				if (val.m_value.boolean) {
					o->write_characters("true", 4);
				} else {
					o->write_characters("false", 5);
				}
				return;
			}

			case value_t::number_integer: {
				dump_integer(val.m_value.number_integer);
				return;
			}

			case value_t::number_unsigned: {
				dump_integer(val.m_value.number_unsigned);
				return;
			}

			case value_t::number_float: {
				dump_float(val.m_value.number_float);
				return;
			}

			case value_t::discarded: {
				o->write_characters("<discarded>", 11);
				return;
			}

			case value_t::null: {
				o->write_characters("null", 4);
				return;
			}
		}
	}